

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

CharIterator * __thiscall
absl::lts_20240722::Cord::Find(CharIterator *__return_storage_ptr__,Cord *this,Cord *needle)

{
  byte bVar1;
  byte bVar2;
  CharIterator needle_end;
  CharIterator needle_end_00;
  string_view needle_00;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  ChunkIterator *pCVar9;
  CharIterator *pCVar10;
  size_t *psVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  string_view needle_01;
  CharIterator haystack_advanced_it;
  CharIterator needle_it;
  ChunkIterator in_stack_fffffffffffffb98;
  ChunkIterator in_stack_fffffffffffffc30;
  char *pcVar14;
  ulong in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  Nullable<absl::cord_internal::CordRep_*> in_stack_fffffffffffffce8;
  ulong in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd04 [92];
  ChunkIterator local_290;
  ChunkIterator local_1f8;
  CharIterator local_160;
  CharIterator local_c8;
  
  bVar12 = 0;
  bVar1 = (needle->contents_).data_.rep_.field_0.data[0];
  uVar7 = (ulong)(char)bVar1;
  if ((uVar7 & 1) == 0) {
    if (bVar1 == 0) goto LAB_0010ea0d;
    sVar8 = uVar7 >> 1;
  }
  else {
    sVar8 = ((needle->contents_).data_.rep_.field_0.as_tree.rep)->length;
    if (sVar8 == 0) goto LAB_0010ea0d;
  }
  bVar2 = (this->contents_).data_.rep_.field_0.data[0];
  uVar4 = (ulong)(char)bVar2;
  if ((uVar4 & 1) == 0) {
    uVar5 = uVar4 >> 1;
  }
  else {
    uVar5 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (sVar8 <= uVar5) {
    if (sVar8 == uVar5) {
      auVar13[0] = -((needle->contents_).data_.rep_.field_0.data[0] ==
                    (this->contents_).data_.rep_.field_0.data[0]);
      auVar13[1] = -((needle->contents_).data_.rep_.field_0.data[1] ==
                    (this->contents_).data_.rep_.field_0.data[1]);
      auVar13[2] = -((needle->contents_).data_.rep_.field_0.data[2] ==
                    (this->contents_).data_.rep_.field_0.data[2]);
      auVar13[3] = -((needle->contents_).data_.rep_.field_0.data[3] ==
                    (this->contents_).data_.rep_.field_0.data[3]);
      auVar13[4] = -((needle->contents_).data_.rep_.field_0.data[4] ==
                    (this->contents_).data_.rep_.field_0.data[4]);
      auVar13[5] = -((needle->contents_).data_.rep_.field_0.data[5] ==
                    (this->contents_).data_.rep_.field_0.data[5]);
      auVar13[6] = -((needle->contents_).data_.rep_.field_0.data[6] ==
                    (this->contents_).data_.rep_.field_0.data[6]);
      auVar13[7] = -((needle->contents_).data_.rep_.field_0.data[7] ==
                    (this->contents_).data_.rep_.field_0.data[7]);
      auVar13[8] = -((needle->contents_).data_.rep_.field_0.data[8] ==
                    (this->contents_).data_.rep_.field_0.data[8]);
      auVar13[9] = -((needle->contents_).data_.rep_.field_0.data[9] ==
                    (this->contents_).data_.rep_.field_0.data[9]);
      auVar13[10] = -((needle->contents_).data_.rep_.field_0.data[10] ==
                     (this->contents_).data_.rep_.field_0.data[10]);
      auVar13[0xb] = -((needle->contents_).data_.rep_.field_0.data[0xb] ==
                      (this->contents_).data_.rep_.field_0.data[0xb]);
      auVar13[0xc] = -((needle->contents_).data_.rep_.field_0.data[0xc] ==
                      (this->contents_).data_.rep_.field_0.data[0xc]);
      auVar13[0xd] = -((needle->contents_).data_.rep_.field_0.data[0xd] ==
                      (this->contents_).data_.rep_.field_0.data[0xd]);
      auVar13[0xe] = -((needle->contents_).data_.rep_.field_0.data[0xe] ==
                      (this->contents_).data_.rep_.field_0.data[0xe]);
      auVar13[0xf] = -((needle->contents_).data_.rep_.field_0.data[0xf] ==
                      (this->contents_).data_.rep_.field_0.data[0xf]);
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar13[0xf] >> 7) << 0xf) != 0xffff) {
        if ((bVar1 & 1) == 0) {
          sVar8 = uVar7 >> 1;
        }
        else {
          sVar8 = ((needle->contents_).data_.rep_.field_0.as_tree.rep)->length;
        }
        if ((bVar2 & 1) == 0) {
          uVar4 = uVar4 >> 1;
        }
        else {
          uVar4 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
        }
        if ((uVar4 != sVar8) ||
           (bVar3 = GenericCompare<bool,absl::lts_20240722::Cord>(this,needle,sVar8), !bVar3))
        goto LAB_0010e76c;
      }
LAB_0010ea0d:
      CharIterator::CharIterator(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    CharIterator::CharIterator(&local_160,needle);
    if (local_160.chunk_iterator_.bytes_remaining_ == 0) {
      Find();
LAB_0010eab4:
      __assert_fail("bytes_remaining_ >= n",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x647,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
    }
    needle_00._M_str = local_160.chunk_iterator_.current_chunk_._M_str;
    needle_00._M_len = local_160.chunk_iterator_.current_chunk_._M_len;
    CharIterator::CharIterator((CharIterator *)&stack0xfffffffffffffcd8,this);
    pCVar10 = (CharIterator *)&stack0xfffffffffffffcd8;
    psVar11 = (size_t *)&stack0xfffffffffffffb98;
    pcVar14 = local_160.chunk_iterator_.current_chunk_._M_str;
    for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
      *psVar11 = (pCVar10->chunk_iterator_).current_chunk_._M_len;
      pCVar10 = (CharIterator *)((long)pCVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      psVar11 = psVar11 + (ulong)bVar12 * -2 + 1;
    }
    FindImpl(&local_160,(Cord *)pCVar10,(CharIterator)in_stack_fffffffffffffb98,needle_00);
    memcpy((CharIterator *)&stack0xfffffffffffffcd8,&local_160,0x98);
    if (sVar8 <= in_stack_fffffffffffffcf0 && in_stack_fffffffffffffcf0 != 0) {
      while( true ) {
        memcpy(&local_290,(ChunkIterator *)&stack0xfffffffffffffcd8,0x98);
        CharIterator::CharIterator((CharIterator *)&local_1f8,needle);
        if (local_290.bytes_remaining_ < local_160.chunk_iterator_.current_chunk_._M_len)
        goto LAB_0010eab4;
        if (local_290.current_chunk_._M_len < local_160.chunk_iterator_.current_chunk_._M_len ||
            local_290.current_chunk_._M_len - local_160.chunk_iterator_.current_chunk_._M_len == 0)
        {
          if (local_160.chunk_iterator_.current_chunk_._M_len != 0) {
            if (((long)local_290.btree_reader_.navigator_.height_ < 0) ||
               (local_290.btree_reader_.navigator_.node_[local_290.btree_reader_.navigator_.height_]
                == (CordRepBtree *)0x0)) {
              local_290.bytes_remaining_ = 0;
            }
            else {
              ChunkIterator::AdvanceBytesBtree
                        (&local_290,local_160.chunk_iterator_.current_chunk_._M_len);
            }
          }
        }
        else {
          local_290.current_chunk_._M_str =
               local_290.current_chunk_._M_str + local_160.chunk_iterator_.current_chunk_._M_len;
          local_290.current_chunk_._M_len =
               local_290.current_chunk_._M_len - local_160.chunk_iterator_.current_chunk_._M_len;
          local_290.bytes_remaining_ =
               local_290.bytes_remaining_ - local_160.chunk_iterator_.current_chunk_._M_len;
        }
        if (local_1f8.bytes_remaining_ < local_160.chunk_iterator_.current_chunk_._M_len)
        goto LAB_0010eab4;
        if (local_1f8.current_chunk_._M_len < local_160.chunk_iterator_.current_chunk_._M_len ||
            local_1f8.current_chunk_._M_len - local_160.chunk_iterator_.current_chunk_._M_len == 0)
        {
          if (local_160.chunk_iterator_.current_chunk_._M_len != 0) {
            if (((long)local_1f8.btree_reader_.navigator_.height_ < 0) ||
               (local_1f8.btree_reader_.navigator_.node_[local_1f8.btree_reader_.navigator_.height_]
                == (CordRepBtree *)0x0)) {
              local_1f8.bytes_remaining_ = 0;
            }
            else {
              ChunkIterator::AdvanceBytesBtree
                        (&local_1f8,local_160.chunk_iterator_.current_chunk_._M_len);
            }
          }
        }
        else {
          local_1f8.current_chunk_._M_str =
               local_1f8.current_chunk_._M_str + local_160.chunk_iterator_.current_chunk_._M_len;
          local_1f8.current_chunk_._M_len =
               local_1f8.current_chunk_._M_len - local_160.chunk_iterator_.current_chunk_._M_len;
          local_1f8.bytes_remaining_ =
               local_1f8.bytes_remaining_ - local_160.chunk_iterator_.current_chunk_._M_len;
        }
        pCVar9 = &local_290;
        psVar11 = (size_t *)&stack0xfffffffffffffb98;
        for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
          *psVar11 = (pCVar9->current_chunk_)._M_len;
          pCVar9 = (ChunkIterator *)((long)pCVar9 + ((ulong)bVar12 * -2 + 1) * 8);
          psVar11 = psVar11 + (ulong)bVar12 * -2 + 1;
        }
        pCVar9 = &local_1f8;
        psVar11 = (size_t *)&stack0xfffffffffffffc30;
        for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
          *psVar11 = (pCVar9->current_chunk_)._M_len;
          pCVar9 = (ChunkIterator *)((long)pCVar9 + (ulong)bVar12 * -0x10 + 8);
          psVar11 = psVar11 + (ulong)bVar12 * -2 + 1;
        }
        needle_end.chunk_iterator_.current_chunk_._M_str = pcVar14;
        needle_end.chunk_iterator_.current_chunk_._M_len = (size_t)__return_storage_ptr__;
        needle_end.chunk_iterator_.current_leaf_ =
             (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffffcd8;
        needle_end.chunk_iterator_.bytes_remaining_ = (size_t)in_stack_fffffffffffffce0;
        needle_end.chunk_iterator_.btree_reader_.remaining_ = (size_t)in_stack_fffffffffffffce8;
        needle_end.chunk_iterator_.btree_reader_.navigator_.height_ = (int)in_stack_fffffffffffffcf0
        ;
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[0] =
             (char)(in_stack_fffffffffffffcf0 >> 0x20);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[1] =
             (char)(in_stack_fffffffffffffcf0 >> 0x28);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[2] =
             (char)(in_stack_fffffffffffffcf0 >> 0x30);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[3] =
             (char)(in_stack_fffffffffffffcf0 >> 0x38);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[4] =
             (char)in_stack_fffffffffffffcf8;
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[5] =
             (char)(in_stack_fffffffffffffcf8 >> 8);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[6] =
             (char)(in_stack_fffffffffffffcf8 >> 0x10);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[7] =
             (char)(in_stack_fffffffffffffcf8 >> 0x18);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[8] =
             (char)(in_stack_fffffffffffffcf8 >> 0x20);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[9] =
             (char)(in_stack_fffffffffffffcf8 >> 0x28);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[10] =
             (char)(in_stack_fffffffffffffcf8 >> 0x30);
        needle_end.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
             (char)(in_stack_fffffffffffffcf8 >> 0x38);
        needle_end.chunk_iterator_.btree_reader_.navigator_.node_[0]._0_4_ =
             in_stack_fffffffffffffd00;
        needle_end.chunk_iterator_.btree_reader_.navigator_.node_._4_92_ = in_stack_fffffffffffffd04
        ;
        bVar3 = anon_unknown_74::IsSubcordInCordAt
                          ((CharIterator)in_stack_fffffffffffffb98,
                           (CharIterator)in_stack_fffffffffffffc30,needle_end);
        if (bVar3) goto LAB_0010ea8d;
        if (in_stack_fffffffffffffcf0 == 0) goto LAB_0010eab4;
        if (in_stack_fffffffffffffcd8 < 2) {
          if (((long)in_stack_fffffffffffffd00 < 0) ||
             (*(long *)(&stack0xfffffffffffffd10 + (long)in_stack_fffffffffffffd00 * 8) == 0)) {
            in_stack_fffffffffffffcf0 = 0;
          }
          else {
            ChunkIterator::AdvanceBytesBtree((ChunkIterator *)&stack0xfffffffffffffcd8,1);
          }
        }
        else {
          in_stack_fffffffffffffce0 = in_stack_fffffffffffffce0 + 1;
          in_stack_fffffffffffffcd8 = in_stack_fffffffffffffcd8 - 1;
          in_stack_fffffffffffffcf0 = in_stack_fffffffffffffcf0 - 1;
        }
        if (in_stack_fffffffffffffcf0 < sVar8) break;
        if (in_stack_fffffffffffffcf0 == sVar8) {
          memcpy(&local_160,&stack0xfffffffffffffcd8,0x98);
          CharIterator::CharIterator(&local_c8,needle);
          pCVar10 = &local_160;
          psVar11 = (size_t *)&stack0xfffffffffffffb98;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *psVar11 = (pCVar10->chunk_iterator_).current_chunk_._M_len;
            pCVar10 = (CharIterator *)((long)pCVar10 + ((ulong)bVar12 * -2 + 1) * 8);
            psVar11 = psVar11 + (ulong)bVar12 * -2 + 1;
          }
          pCVar10 = &local_c8;
          psVar11 = (size_t *)&stack0xfffffffffffffc30;
          for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
            *psVar11 = (pCVar10->chunk_iterator_).current_chunk_._M_len;
            pCVar10 = (CharIterator *)((long)pCVar10 + ((ulong)bVar12 * -2 + 1) * 8);
            psVar11 = psVar11 + (ulong)bVar12 * -2 + 1;
          }
          needle_end_00.chunk_iterator_.current_chunk_._M_str = pcVar14;
          needle_end_00.chunk_iterator_.current_chunk_._M_len = (size_t)__return_storage_ptr__;
          needle_end_00.chunk_iterator_.current_leaf_ =
               (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffffcd8;
          needle_end_00.chunk_iterator_.bytes_remaining_ = (size_t)in_stack_fffffffffffffce0;
          needle_end_00.chunk_iterator_.btree_reader_.remaining_ = (size_t)in_stack_fffffffffffffce8
          ;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.height_ =
               (int)in_stack_fffffffffffffcf0;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[0] =
               (char)(in_stack_fffffffffffffcf0 >> 0x20);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[1] =
               (char)(in_stack_fffffffffffffcf0 >> 0x28);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[2] =
               (char)(in_stack_fffffffffffffcf0 >> 0x30);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[3] =
               (char)(in_stack_fffffffffffffcf0 >> 0x38);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[4] =
               (char)in_stack_fffffffffffffcf8;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[5] =
               (char)(in_stack_fffffffffffffcf8 >> 8);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[6] =
               (char)(in_stack_fffffffffffffcf8 >> 0x10);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[7] =
               (char)(in_stack_fffffffffffffcf8 >> 0x18);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[8] =
               (char)(in_stack_fffffffffffffcf8 >> 0x20);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[9] =
               (char)(in_stack_fffffffffffffcf8 >> 0x28);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[10] =
               (char)(in_stack_fffffffffffffcf8 >> 0x30);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
               (char)(in_stack_fffffffffffffcf8 >> 0x38);
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[0]._0_4_ =
               in_stack_fffffffffffffd00;
          needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_._4_92_ =
               in_stack_fffffffffffffd04;
          bVar3 = anon_unknown_74::IsSubcordInCordAt
                            ((CharIterator)in_stack_fffffffffffffb98,
                             (CharIterator)in_stack_fffffffffffffc30,needle_end_00);
          if (!bVar3) break;
LAB_0010ea8d:
          memcpy(__return_storage_ptr__,&stack0xfffffffffffffcd8,0x98);
          return __return_storage_ptr__;
        }
        pCVar9 = (ChunkIterator *)&stack0xfffffffffffffcd8;
        psVar11 = (size_t *)&stack0xfffffffffffffb98;
        for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
          *psVar11 = (pCVar9->current_chunk_)._M_len;
          pCVar9 = (ChunkIterator *)((long)pCVar9 + (ulong)bVar12 * -0x10 + 8);
          psVar11 = psVar11 + (ulong)bVar12 * -2 + 1;
        }
        needle_01._M_str = pcVar14;
        needle_01._M_len = local_160.chunk_iterator_.current_chunk_._M_len;
        FindImpl(&local_160,(Cord *)pCVar9,(CharIterator)in_stack_fffffffffffffb98,needle_01);
        memcpy((ChunkIterator *)&stack0xfffffffffffffcd8,&local_160,0x98);
        if ((in_stack_fffffffffffffcf0 == 0) || (in_stack_fffffffffffffcf0 < sVar8)) break;
      }
    }
  }
LAB_0010e76c:
  memset(__return_storage_ptr__,0,0x98);
  (__return_storage_ptr__->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::Find(const absl::Cord& needle) const {
  if (needle.empty()) {
    return char_begin();
  }
  const auto needle_size = needle.size();
  if (needle_size > size()) {
    return char_end();
  }
  if (needle_size == size()) {
    return *this == needle ? char_begin() : char_end();
  }
  const auto needle_chunk = Cord::ChunkRemaining(needle.char_begin());
  auto haystack_it = char_begin();
  while (true) {
    haystack_it = FindImpl(haystack_it, needle_chunk);
    if (haystack_it == char_end() ||
        haystack_it.chunk_iterator_.bytes_remaining_ < needle_size) {
      break;
    }
    // We found the first chunk of `needle` at `haystack_it` but not the entire
    // subcord. Advance past the first chunk and check for the remainder.
    auto haystack_advanced_it = haystack_it;
    auto needle_it = needle.char_begin();
    Cord::Advance(&haystack_advanced_it, needle_chunk.size());
    Cord::Advance(&needle_it, needle_chunk.size());
    if (IsSubcordInCordAt(haystack_advanced_it, needle_it, needle.char_end())) {
      return haystack_it;
    }
    Cord::Advance(&haystack_it, 1);
    if (haystack_it.chunk_iterator_.bytes_remaining_ < needle_size) {
      break;
    }
    if (haystack_it.chunk_iterator_.bytes_remaining_ == needle_size) {
      // Special case, if there is exactly `needle_size` bytes remaining, the
      // subcord is either at `haystack_it` or not at all.
      if (IsSubcordInCordAt(haystack_it, needle)) {
        return haystack_it;
      }
      break;
    }
  }
  return char_end();
}